

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

int __thiscall ON_BinaryArchive::Read3dmLayer(ON_BinaryArchive *this,ON_Layer **ppLayer)

{
  bool bVar1;
  int iVar2;
  ON_Object *local_40;
  ON_Object *p;
  ON_Layer *layer;
  ON__INT64 big_value;
  ON_Layer **ppOStack_20;
  ON__UINT32 tcode;
  ON_Layer **ppLayer_local;
  ON_BinaryArchive *this_local;
  
  ppOStack_20 = ppLayer;
  ppLayer_local = (ON_Layer **)this;
  bVar1 = Read3dmTableRecord(this,layer_table,ppLayer);
  if (bVar1) {
    p = (ON_Object *)0x0;
    if (this->m_3dm_version == 1) {
      bVar1 = Read3dmV1Layer(this,(ON_Layer **)&p);
      if ((bVar1) && (p != (ON_Object *)0x0)) {
        Internal_Read3dmUpdateManifest(this,(ON_ModelComponent *)p);
      }
    }
    else {
      big_value._4_4_ = 0;
      layer = (ON_Layer *)0x0;
      bVar1 = BeginRead3dmBigChunk(this,(uint *)((long)&big_value + 4),(ON__INT64 *)&layer);
      if (bVar1) {
        if (big_value._4_4_ == 0x20008050) {
          Internal_Increment3dmTableItemCount(this);
          local_40 = (ON_Object *)0x0;
          iVar2 = ReadObject(this,&local_40);
          if (iVar2 != 0) {
            p = (ON_Object *)ON_Layer::Cast(local_40);
            if ((ON_Layer *)p == (ON_Layer *)0x0) {
              if (local_40 != (ON_Object *)0x0) {
                (*local_40->_vptr_ON_Object[4])();
              }
            }
            else {
              Internal_Read3dmUpdateManifest(this,(ON_ModelComponent *)p);
            }
          }
          if (p == (ON_Object *)0x0) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                       ,0x2864,"","ON_BinaryArchive::Read3dmLayer() - corrupt layer table");
          }
        }
        else if (big_value._4_4_ != -1) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                     ,0x2868,"","ON_BinaryArchive::Read3dmLayer() - corrupt layer table");
        }
        EndRead3dmChunk(this);
      }
    }
    if (p != (ON_Object *)0x0) {
      ON_Layer::HasPerViewportSettings((ON_Layer *)p,&ON_nil_uuid);
    }
    *ppOStack_20 = (ON_Layer *)p;
    this_local._4_4_ = (uint)(p != (ON_Object *)0x0);
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int ON_BinaryArchive::Read3dmLayer( ON_Layer** ppLayer )
{
  if ( false == Read3dmTableRecord(ON_3dmArchiveTableType::layer_table, (void**)ppLayer))
    return 0;

  ON__UINT32 tcode;
  ON__INT64 big_value;
  ON_Layer* layer = nullptr;
  // returns 0 at end of layer table
  if ( m_3dm_version == 1 )
  {
    if (Read3dmV1Layer(layer) && nullptr != layer)
      Internal_Read3dmUpdateManifest(*layer);
  }
  else 
  {
    // version 2+
    tcode = 0;
    big_value = 0;
    if ( BeginRead3dmBigChunk( &tcode, &big_value ) )
    {
      if ( tcode == TCODE_LAYER_RECORD )
      {
        Internal_Increment3dmTableItemCount();
        ON_Object* p = 0;
        if ( ReadObject( &p ) )
        {
          layer = ON_Layer::Cast(p);
          if ( nullptr == layer )
            delete p;
          else
          {
            Internal_Read3dmUpdateManifest(*layer);
          }
        }
        if (nullptr == layer) {
          ON_ERROR("ON_BinaryArchive::Read3dmLayer() - corrupt layer table");
        }
      }
      else if ( tcode != TCODE_ENDOFTABLE ) {
        ON_ERROR("ON_BinaryArchive::Read3dmLayer() - corrupt layer table");
      }
      EndRead3dmChunk();
    }
  }
  if ( layer )
    layer->HasPerViewportSettings(ON_nil_uuid); // this call sets ON_Layer::m__runtime_flags
  *ppLayer = layer;
  return (layer) ? 1 : 0;
}